

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O3

void __thiscall
QtMWidgets::TableViewCellLayout::setTextGeometry
          (TableViewCellLayout *this,QRect *r,int imageOffset,int accessoryWidth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TextLabel *pTVar4;
  
  iVar2 = r->x1;
  iVar3 = r->x2;
  if (accessoryWidth < 1) {
    iVar1 = 0;
  }
  else {
    iVar1 = (**(code **)(*(long *)this + 0x60))(this);
  }
  iVar2 = (**(code **)(*(long *)this->textLabel + 0x80))
                    (this->textLabel,(iVar3 - (accessoryWidth + imageOffset + iVar1 + iVar2)) + 1);
  iVar3 = (**(code **)(*(long *)this->detailedTextLabel + 0x80))();
  if (iVar2 == 0 || iVar3 != 0) {
    if (iVar3 == 0 || iVar2 != 0) {
      if (iVar2 == 0 || iVar3 == 0) {
        return;
      }
      QWidget::setGeometry((QRect *)this->textLabel);
      pTVar4 = this->detailedTextLabel;
    }
    else {
      QWidget::setGeometry((QRect *)this->detailedTextLabel);
      pTVar4 = this->textLabel;
    }
  }
  else {
    QWidget::setGeometry((QRect *)this->textLabel);
    pTVar4 = this->detailedTextLabel;
  }
  QWidget::setGeometry((QRect *)pTVar4);
  return;
}

Assistant:

void
TableViewCellLayout::setTextGeometry( const QRect & r, int imageOffset,
	int accessoryWidth )
{
	const int width = r.width() - imageOffset - accessoryWidth -
		( accessoryWidth > 0 ? spacing() : 0 );
	const int textHeight = textLabel->heightForWidth( width );
	const int detailedTextHeight = detailedTextLabel->heightForWidth( width );

	if( detailedTextHeight == 0 && textHeight != 0 )
	{
		textLabel->setGeometry( r.x() + imageOffset, r.y() +
				( r.height() > textHeight ? ( r.height() - textHeight ) / 2 : 0 ),
			width, textHeight );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
	}
	else if( textHeight == 0 && detailedTextHeight != 0 )
	{
		detailedTextLabel->setGeometry( r.x() + imageOffset, r.y() +
				( r.height() > detailedTextHeight ?
					( r.height() - detailedTextHeight ) / 2 : 0 ),
			width, detailedTextHeight );
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
	}
	else if( textHeight != 0 && detailedTextHeight != 0 )
	{
		const int h = ( r.height() > textHeight + detailedTextHeight ?
			( r.height() - textHeight - detailedTextHeight ) / 2 : 0 );
		textLabel->setGeometry( r.x() + imageOffset, r.y() + h,
			width, textHeight );
		detailedTextLabel->setGeometry( r.x() + imageOffset, r.y() + h +
			textHeight, width, detailedTextHeight );
	}
}